

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_column_reader.cpp
# Opt level: O0

idx_t __thiscall
duckdb::ExpressionColumnReader::Read
          (ExpressionColumnReader *this,uint64_t num_values,data_ptr_t define_out,
          data_ptr_t repeat_out,Vector *result)

{
  int iVar1;
  reference pvVar2;
  pointer pCVar3;
  undefined4 extraout_var;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  vector<duckdb::Vector,_true> *in_RDI;
  idx_t amount;
  value_type *intermediate_vector;
  size_type in_stack_ffffffffffffffb8;
  
  duckdb::DataChunk::Reset();
  pvVar2 = vector<duckdb::Vector,_true>::operator[](in_RDI,in_stack_ffffffffffffffb8);
  pCVar3 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
           operator->((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
                       *)in_RDI);
  iVar1 = (*pCVar3->_vptr_ColumnReader[3])(pCVar3,in_RSI,in_RDX,in_RCX,pvVar2);
  DataChunk::SetCardinality((DataChunk *)(in_RDI + 0x200),CONCAT44(extraout_var,iVar1));
  duckdb::ExpressionExecutor::ExecuteExpression
            ((DataChunk *)(in_RDI + 0x248),(Vector *)(in_RDI + 0x200));
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

idx_t ExpressionColumnReader::Read(uint64_t num_values, data_ptr_t define_out, data_ptr_t repeat_out, Vector &result) {
	intermediate_chunk.Reset();
	auto &intermediate_vector = intermediate_chunk.data[0];

	auto amount = child_reader->Read(num_values, define_out, repeat_out, intermediate_vector);
	// Execute the expression
	intermediate_chunk.SetCardinality(amount);
	executor.ExecuteExpression(intermediate_chunk, result);
	return amount;
}